

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s5.c
# Opt level: O3

s5_err s5_parse(s5_ctx *cx,uint8_t **data,size_t *size)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  size_t sVar5;
  s5_err sVar6;
  uint8_t uVar7;
  byte bVar8;
  size_t sVar9;
  size_t sVar10;
  uint uVar11;
  bool bVar12;
  
  puVar4 = *data;
  sVar5 = *size;
  if (sVar5 == 0) {
    sVar6 = s5_ok;
    sVar10 = 0;
    goto LAB_0010fd2b;
  }
  bVar8 = cx->state;
  sVar10 = 0;
  sVar9 = 1;
LAB_0010fab4:
  if (0x10 < bVar8) {
    abort();
  }
  bVar1 = puVar4[sVar9 - 1];
  uVar11 = (uint)bVar1;
  sVar10 = sVar10 + 1;
  switch(bVar8) {
  case 0:
    if (bVar1 != 5) {
LAB_0010fcf0:
      sVar6 = s5_bad_version;
      goto LAB_0010fd2b;
    }
    cx->state = '\x01';
    bVar8 = 1;
    break;
  case 1:
    cx->arg0 = 0;
    cx->arg1 = uVar11;
    cx->state = '\x02';
    bVar8 = 2;
    break;
  case 2:
    uVar11 = cx->arg0;
    if (uVar11 < cx->arg1) {
      if (bVar1 < 3) {
        cx->methods = cx->methods | (byte)(0x40201 >> ((bVar1 & 3) << 3));
      }
      uVar11 = uVar11 + 1;
      cx->arg0 = uVar11;
    }
    bVar8 = 2;
    if (uVar11 == cx->arg1) {
      sVar6 = s5_auth_select;
      goto LAB_0010fd2b;
    }
    break;
  case 3:
    if (bVar1 != 1) goto LAB_0010fcf0;
    cx->state = '\x04';
    bVar8 = 4;
    break;
  case 4:
    cx->arg0 = 0;
    cx->userlen = bVar1;
    cx->state = '\x05';
    bVar8 = 5;
    break;
  case 5:
    uVar11 = cx->arg0;
    bVar2 = cx->userlen;
    if (uVar11 < bVar2) {
      cx->username[uVar11] = bVar1;
      uVar11 = uVar11 + 1;
      cx->arg0 = uVar11;
    }
    bVar8 = 5;
    if (uVar11 == bVar2) {
      cx->username[bVar2] = '\0';
      cx->state = '\x06';
      bVar8 = 6;
    }
    break;
  case 6:
    cx->arg0 = 0;
    cx->passlen = bVar1;
    cx->state = '\a';
    bVar8 = 7;
    break;
  case 7:
    uVar11 = cx->arg0;
    bVar2 = cx->passlen;
    if (uVar11 < bVar2) {
      cx->password[uVar11] = bVar1;
      uVar11 = uVar11 + 1;
      cx->arg0 = uVar11;
    }
    bVar8 = 7;
    if (uVar11 == bVar2) {
      cx->password[bVar2] = '\0';
      sVar6 = s5_auth_verify;
      uVar7 = '\b';
      goto LAB_0010fd17;
    }
    break;
  case 8:
    if (bVar1 != 5) goto LAB_0010fcf0;
    cx->state = '\t';
    bVar8 = 9;
    break;
  case 9:
    if (uVar11 == 1) {
      uVar7 = '\0';
    }
    else {
      if (uVar11 != 3) {
        sVar6 = s5_bad_cmd;
        goto LAB_0010fd2b;
      }
      uVar7 = '\x02';
    }
    cx->cmd = uVar7;
    cx->state = '\n';
    bVar8 = 10;
    break;
  case 10:
    cx->state = '\v';
    bVar8 = 0xb;
    break;
  case 0xb:
    cx->arg0 = 0;
    if (uVar11 == 4) {
      cx->state = '\r';
      cx->atyp = '\x01';
      cx->arg1 = 0x10;
      goto LAB_0010fccb;
    }
    if (uVar11 == 3) {
      cx->state = '\f';
      cx->atyp = '\x02';
      cx->arg1 = 0;
      bVar8 = 0xc;
      break;
    }
    if (uVar11 != 1) {
      sVar6 = s5_bad_atyp;
      sVar10 = sVar9;
      goto LAB_0010fd2b;
    }
    cx->state = '\r';
    cx->atyp = '\0';
    cx->arg1 = 4;
    goto LAB_0010fccb;
  case 0xc:
    cx->arg1 = uVar11;
    cx->state = '\r';
LAB_0010fccb:
    bVar8 = 0xd;
    break;
  case 0xd:
    uVar11 = cx->arg0;
    uVar3 = cx->arg1;
    if (uVar11 < uVar3) {
      cx->daddr[uVar11] = bVar1;
      uVar11 = uVar11 + 1;
      cx->arg0 = uVar11;
    }
    bVar8 = 0xd;
    if (uVar11 == uVar3) {
      cx->daddr[uVar3] = '\0';
      cx->state = '\x0e';
      bVar8 = 0xe;
    }
    break;
  case 0xe:
    cx->dport = (ushort)bVar1 << 8;
    cx->state = '\x0f';
    bVar8 = 0xf;
    break;
  case 0xf:
    cx->dport = cx->dport | (ushort)bVar1;
    sVar6 = s5_exec_cmd;
    uVar7 = '\x10';
LAB_0010fd17:
    cx->state = uVar7;
    sVar10 = sVar9;
    goto LAB_0010fd2b;
  }
  bVar12 = sVar9 == sVar5;
  sVar9 = sVar9 + 1;
  if (bVar12) goto code_r0x0010fce2;
  goto LAB_0010fab4;
code_r0x0010fce2:
  sVar6 = s5_ok;
  sVar10 = sVar5;
LAB_0010fd2b:
  *data = puVar4 + sVar10;
  *size = sVar5 - sVar10;
  return sVar6;
}

Assistant:

s5_err s5_parse(s5_ctx *cx, uint8_t **data, size_t *size) {
  s5_err err;
  uint8_t *p;
  uint8_t c;
  size_t i;
  size_t n;

  p = *data;
  n = *size;
  i = 0;

  while (i < n) {
    c = p[i];
    i += 1;
    switch (cx->state) {
      case s5_version:
        if (c != 5) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_nmethods;
        break;

      case s5_nmethods:
        cx->arg0 = 0;
        cx->arg1 = c;  /* Number of bytes to read. */
        cx->state = s5_methods;
        break;

      case s5_methods:
        if (cx->arg0 < cx->arg1) {
          switch (c) {
            case 0:
              cx->methods |= S5_AUTH_NONE;
              break;
            case 1:
              cx->methods |= S5_AUTH_GSSAPI;
              break;
            case 2:
              cx->methods |= S5_AUTH_PASSWD;
              break;
            /* Ignore everything we don't understand. */
          }
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->arg1) {
          err = s5_auth_select;
          goto out;
        }
        break;

      case s5_auth_pw_version:
        if (c != 1) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_auth_pw_userlen;
        break;

      case s5_auth_pw_userlen:
        cx->arg0 = 0;
        cx->userlen = c;
        cx->state = s5_auth_pw_username;
        break;

      case s5_auth_pw_username:
        if (cx->arg0 < cx->userlen) {
          cx->username[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->userlen) {
          cx->username[cx->userlen] = '\0';
          cx->state = s5_auth_pw_passlen;
        }
        break;

      case s5_auth_pw_passlen:
        cx->arg0 = 0;
        cx->passlen = c;
        cx->state = s5_auth_pw_password;
        break;

      case s5_auth_pw_password:
        if (cx->arg0 < cx->passlen) {
          cx->password[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->passlen) {
          cx->password[cx->passlen] = '\0';
          cx->state = s5_req_version;
          err = s5_auth_verify;
          goto out;
        }
        break;

      case s5_req_version:
        if (c != 5) {
          err = s5_bad_version;
          goto out;
        }
        cx->state = s5_req_cmd;
        break;

      case s5_req_cmd:
        switch (c) {
          case 1:  /* TCP connect */
            cx->cmd = s5_cmd_tcp_connect;
            break;
          case 3:  /* UDP associate */
            cx->cmd = s5_cmd_udp_assoc;
            break;
          default:
            err = s5_bad_cmd;
            goto out;
        }
        cx->state = s5_req_reserved;
        break;

      case s5_req_reserved:
        cx->state = s5_req_atyp;
        break;

      case s5_req_atyp:
        cx->arg0 = 0;
        switch (c) {
          case 1:  /* IPv4, four octets. */
            cx->state = s5_req_daddr;
            cx->atyp = s5_atyp_ipv4;
            cx->arg1 = 4;
            break;
          case 3:  /* Hostname.  First byte is length. */
            cx->state = s5_req_atyp_host;
            cx->atyp = s5_atyp_host;
            cx->arg1 = 0;
            break;
          case 4:  /* IPv6, sixteen octets. */
            cx->state = s5_req_daddr;
            cx->atyp = s5_atyp_ipv6;
            cx->arg1 = 16;
            break;
          default:
            err = s5_bad_atyp;
            goto out;
        }
        break;

      case s5_req_atyp_host:
        cx->arg1 = c;
        cx->state = s5_req_daddr;
        break;

      case s5_req_daddr:
        if (cx->arg0 < cx->arg1) {
          cx->daddr[cx->arg0] = c;
          cx->arg0 += 1;
        }
        if (cx->arg0 == cx->arg1) {
          cx->daddr[cx->arg1] = '\0';
          cx->state = s5_req_dport0;
        }
        break;

      case s5_req_dport0:
        cx->dport = c << 8;
        cx->state = s5_req_dport1;
        break;

      case s5_req_dport1:
        cx->dport |= c;
        cx->state = s5_dead;
        err = s5_exec_cmd;
        goto out;

      case s5_dead:
        break;

      default:
        abort();
    }
  }
  err = s5_ok;

out:
  *data = p + i;
  *size = n - i;
  return err;
}